

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O0

void __thiscall QTzTimeZonePrivate::QTzTimeZonePrivate(QTzTimeZonePrivate *this,QByteArray *ianaId)

{
  long lVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QTzTimeZoneCacheEntry entry;
  QTzTimeZoneCacheEntry *in_stack_ffffffffffffff18;
  QTimeZonePrivate *in_stack_ffffffffffffff20;
  QTzTimeZonePrivate *this_00;
  undefined7 in_stack_ffffffffffffff30;
  QByteArray *in_stack_ffffffffffffff60;
  QTzTimeZoneCache *in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QTimeZonePrivate::QTimeZonePrivate(in_stack_ffffffffffffff20);
  *in_RDI = &PTR__QTzTimeZonePrivate_00beb6c8;
  this_00 = (QTzTimeZonePrivate *)(in_RDI + 5);
  QTzTimeZoneCacheEntry::QTzTimeZoneCacheEntry((QTzTimeZoneCacheEntry *)this_00);
  uVar2 = isTimeZoneIdAvailable(this_00,(QByteArray *)in_stack_ffffffffffffff18);
  if ((bool)uVar2) {
    if ((QTzTimeZonePrivate(QByteArray_const&)::tzCache == '\0') &&
       (iVar4 = __cxa_guard_acquire(&QTzTimeZonePrivate(QByteArray_const&)::tzCache), iVar4 != 0)) {
      QTzTimeZoneCache::QTzTimeZoneCache
                ((QTzTimeZoneCache *)CONCAT17(uVar2,in_stack_ffffffffffffff30));
      __cxa_atexit(QTzTimeZoneCache::~QTzTimeZoneCache,&QTzTimeZonePrivate::tzCache,&__dso_handle);
      __cxa_guard_release(&QTzTimeZonePrivate(QByteArray_const&)::tzCache);
    }
    QTzTimeZoneCache::fetchEntry(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    bVar3 = QList<QTzTransitionTime>::isEmpty((QList<QTzTransitionTime> *)0x748f09);
    if ((!bVar3) || (bVar3 = QByteArray::isEmpty((QByteArray *)0x748f1d), !bVar3)) {
      QTzTimeZoneCacheEntry::operator=((QTzTimeZoneCacheEntry *)this_00,in_stack_ffffffffffffff18);
      QByteArray::operator=((QByteArray *)this_00,(QByteArray *)in_stack_ffffffffffffff18);
      bVar3 = QByteArray::isEmpty((QByteArray *)0x748f87);
      if (bVar3) {
        QDateTime::currentMSecsSinceEpoch();
        abbreviation((QTzTimeZonePrivate *)CONCAT17(uVar2,in_stack_ffffffffffffff30),(qint64)in_RDI)
        ;
        QString::toUtf8((QString *)in_stack_ffffffffffffff18);
        QByteArray::operator=((QByteArray *)this_00,(QByteArray *)in_stack_ffffffffffffff18);
        QByteArray::~QByteArray((QByteArray *)0x748fd7);
        QString::~QString((QString *)0x748fe1);
      }
    }
    QTzTimeZoneCacheEntry::~QTzTimeZoneCacheEntry((QTzTimeZoneCacheEntry *)this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QTzTimeZonePrivate::QTzTimeZonePrivate(const QByteArray &ianaId)
{
    if (!isTimeZoneIdAvailable(ianaId)) // Avoid pointlessly creating cache entries
        return;
    static QTzTimeZoneCache tzCache;
    auto entry = tzCache.fetchEntry(ianaId);
    if (entry.m_tranTimes.isEmpty() && entry.m_posixRule.isEmpty())
        return; // Invalid after all !

    cached_data = std::move(entry);
    m_id = ianaId;
    // Avoid empty ID, if we have an abbreviation to use instead
    if (m_id.isEmpty()) {
        // This can only happen for the system zone, when we've read the
        // contents of /etc/localtime because it wasn't a symlink.
        // TODO: use CLDR generic abbreviation for the zone.
        m_id = abbreviation(QDateTime::currentMSecsSinceEpoch()).toUtf8();
    }
}